

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::XFBGetProgramResourceAPITest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,XFBGetProgramResourceAPITest *this,GLuint test_case_index)

{
  ostream *poVar1;
  GLchar *pGVar2;
  TestError *this_00;
  pointer ptVar3;
  stringstream stream;
  ostream local_1a0;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  ptVar3 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::XFBGetProgramResourceAPITest::test_Case,_std::allocator<gl4cts::EnhancedLayouts::XFBGetProgramResourceAPITest::test_Case>_>
           ._M_impl.super__Vector_impl_data._M_start + test_case_index;
  poVar1 = std::operator<<(&local_1a0,"Stage: ");
  pGVar2 = Utils::Shader::GetStageName(ptVar3->m_stage);
  poVar1 = std::operator<<(poVar1,pGVar2);
  poVar1 = std::operator<<(poVar1,", type: ");
  pGVar2 = Utils::Type::GetGLSLTypeName(&ptVar3->m_type);
  poVar1 = std::operator<<(poVar1,pGVar2);
  std::operator<<(poVar1,", case: ");
  if ((ulong)ptVar3->m_case < 3) {
    std::operator<<(&local_1a0,&DAT_016523bc + *(int *)(&DAT_016523bc + (ulong)ptVar3->m_case * 4));
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    return __return_storage_ptr__;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
             ,0x578b);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string XFBGetProgramResourceAPITest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	const test_Case&  test_case = m_test_cases[test_case_index];

	stream << "Stage: " << Utils::Shader::GetStageName(test_case.m_stage)
		   << ", type: " << test_case.m_type.GetGLSLTypeName() << ", case: ";

	switch (test_case.m_case)
	{
	case INTERLEAVED:
		stream << "interleaved";
		break;
	case SEPARATED:
		stream << "separated";
		break;
	case XFB:
		stream << "xfb";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return stream.str();
}